

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_fatalfailure_tests.cpp
# Opt level: O0

void __thiscall
iu_NoFatalFailureTest_x_iutest_x_Expect_Test::Body
          (iu_NoFatalFailureTest_x_iutest_x_Expect_Test *this)

{
  bool bVar1;
  int iVar2;
  AssertionHelper local_1f8;
  Fixed local_1c8;
  int local_40;
  undefined1 local_30 [8];
  Counter<iutest::detail::NewTestPartResultCheckHelper::CondEq<(iutest::TestPartResult::Type)2>,_iutest::detail::DefaultGlobalTestPartResultReporter>
  iutest_failure_checker;
  iu_NoFatalFailureTest_x_iutest_x_Expect_Test *this_local;
  
  iutest_failure_checker._24_8_ = this;
  iutest::detail::AlwaysZero();
  bVar1 = iutest::detail::AlwaysTrue();
  if (bVar1) {
    iutest::detail::NewTestPartResultCheckHelper::
    Counter<iutest::detail::NewTestPartResultCheckHelper::CondEq<(iutest::TestPartResult::Type)2>,_iutest::detail::DefaultGlobalTestPartResultReporter>
    ::Counter((Counter<iutest::detail::NewTestPartResultCheckHelper::CondEq<(iutest::TestPartResult::Type)2>,_iutest::detail::DefaultGlobalTestPartResultReporter>
               *)local_30);
    bVar1 = iutest::detail::AlwaysTrue();
    if (bVar1) {
      OccurNonFatalFailure();
    }
    iVar2 = iutest::detail::NewTestPartResultCheckHelper::
            Counter<iutest::detail::NewTestPartResultCheckHelper::CondEq<(iutest::TestPartResult::Type)2>,_iutest::detail::DefaultGlobalTestPartResultReporter>
            ::count((Counter<iutest::detail::NewTestPartResultCheckHelper::CondEq<(iutest::TestPartResult::Type)2>,_iutest::detail::DefaultGlobalTestPartResultReporter>
                     *)local_30);
    if (iVar2 < 1) {
      local_40 = 0;
    }
    else {
      local_40 = 3;
    }
    iutest::detail::NewTestPartResultCheckHelper::
    Counter<iutest::detail::NewTestPartResultCheckHelper::CondEq<(iutest::TestPartResult::Type)2>,_iutest::detail::DefaultGlobalTestPartResultReporter>
    ::~Counter((Counter<iutest::detail::NewTestPartResultCheckHelper::CondEq<(iutest::TestPartResult::Type)2>,_iutest::detail::DefaultGlobalTestPartResultReporter>
                *)local_30);
    if (local_40 == 0) {
      return;
    }
  }
  memset(&local_1c8,0,0x188);
  iutest::AssertionHelper::Fixed::Fixed(&local_1c8);
  iutest::AssertionHelper::AssertionHelper
            (&local_1f8,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/no_fatalfailure_tests.cpp"
             ,0x26,
             "\nExpected: OccurNonFatalFailure() doesn\'t generate new fatal failure.\n  Actual: it does."
             ,kNonFatalFailure);
  iutest::AssertionHelper::operator=(&local_1f8,&local_1c8);
  iutest::AssertionHelper::~AssertionHelper(&local_1f8);
  iutest::AssertionHelper::Fixed::~Fixed(&local_1c8);
  return;
}

Assistant:

IUTEST(NoFatalFailureTest, Expect)
{
    IUTEST_EXPECT_NO_FATAL_FAILURE(OccurNonFatalFailure());
}